

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

int __thiscall asmjit::Assembler::bind(Assembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  Logger *pLVar2;
  Slot *pSVar3;
  CodeHolder *pCVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined4 in_register_00000034;
  uint32_t size;
  int32_t patchedValue;
  RelocEntry *re;
  uint32_t relocId;
  intptr_t offset;
  LabelLink *prev;
  LabelLink *link;
  size_t pos;
  char *in_stack_00000080;
  Error err;
  size_t binSize;
  StringBuilderTmp<256UL> sb;
  LabelEntry *le;
  uint32_t slot;
  size_t index;
  ZoneVector<asmjit::RelocEntry_*> *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  Error error;
  CodeEmitter *in_stack_fffffffffffffc98;
  long lVar8;
  char *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  size_t in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  uint8_t *in_stack_fffffffffffffce8;
  Slot *pSVar9;
  StringBuilder *in_stack_fffffffffffffcf0;
  int local_304;
  StringBuilder local_2f8;
  char local_2d8 [32];
  Error local_1b8;
  undefined1 local_f4 [4];
  undefined8 local_f0;
  Slot *local_e8;
  ZoneHeap *local_e0;
  SectionEntry *local_d8;
  Assembler *local_d0;
  ulong local_c8;
  int local_bc;
  CodeHolder *local_b8;
  int local_ac;
  ZoneVector<asmjit::LabelEntry_*> *local_a8;
  ulong local_a0;
  ZoneVector<asmjit::LabelEntry_*> *local_98;
  ZoneVector<asmjit::LabelEntry_*> *local_90;
  int *local_88;
  CodeEmitter *local_80;
  int local_74;
  int *local_70;
  int local_64;
  int *local_60;
  int local_54;
  int *local_50;
  ZoneHeap *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_29;
  undefined1 *local_28;
  StringBuilder *local_20;
  ZoneVector<asmjit::RelocEntry_*> *local_18;
  undefined4 local_c;
  undefined4 local_8;
  int local_4;
  
  error = (Error)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  if ((this->super_CodeEmitter)._lastError == 0) {
    if ((this->super_CodeEmitter)._code == (CodeHolder *)0x0) {
      DebugUtils::assertionFailed(in_stack_00000080,pos._4_4_,(char *)link);
    }
    local_b8 = (this->super_CodeEmitter)._code;
    local_bc = *(int *)(CONCAT44(in_register_00000034,__fd) + 4);
    local_c8 = (ulong)(local_bc - 0x100);
    local_a8 = &local_b8->_labels;
    local_ac = local_bc;
    if (local_c8 < (local_b8->_labels).super_ZoneVectorBase._length) {
      local_98 = &local_b8->_labels;
      local_a0 = local_c8;
      if ((local_b8->_labels).super_ZoneVectorBase._length <= local_c8) {
        DebugUtils::assertionFailed(in_stack_00000080,pos._4_4_,(char *)link);
      }
      lVar8 = *(long *)((long)(local_98->super_ZoneVectorBase)._data + local_c8 * 8);
      local_90 = local_98;
    }
    else {
      lVar8 = 0;
    }
    if (lVar8 == 0) {
      local_1b8 = CodeEmitter::setLastError
                            (in_stack_fffffffffffffc98,error,(char *)in_stack_fffffffffffffc88);
    }
    else if (*(int *)(lVar8 + 0x18) == -1) {
      if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
        local_20 = &local_2f8;
        local_28 = &NoInit;
        local_2f8._data = local_2d8;
        local_2d8[0] = '\0';
        local_2f8._length = 0;
        local_2f8._capacity = 0x100;
        local_2f8._canFree = 0;
        local_88 = (int *)(lVar8 + 0x30);
        if (*local_88 == 0) {
          StringBuilder::setFormat
                    (&local_2f8,"L%u:",
                     (ulong)(*(int *)(CONCAT44(in_register_00000034,__fd) + 4) - 0x100));
        }
        else {
          in_stack_fffffffffffffc98 = (CodeEmitter *)(lVar8 + 0x30);
          if (*(uint *)&in_stack_fffffffffffffc98->_vptr_CodeEmitter < 0xc) {
            lVar6 = lVar8 + 0x34;
          }
          else {
            lVar6 = *(long *)(lVar8 + 0x38);
          }
          local_80 = in_stack_fffffffffffffc98;
          StringBuilder::setFormat(&local_2f8,"%s:",lVar6);
          error = (Error)((ulong)lVar6 >> 0x20);
        }
        Logging::formatLine(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                            in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                            CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffcc8);
        pLVar2 = ((this->super_CodeEmitter)._code)->_logger;
        (*pLVar2->_vptr_Logger[2])(pLVar2,local_2f8._data,local_2f8._length);
        StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x1eb49e);
      }
      local_304 = 0;
      lVar6 = (long)this->_bufferPtr - (long)this->_bufferData;
      pSVar3 = *(Slot **)(lVar8 + 0x28);
      while (pSVar9 = pSVar3, pSVar9 != (Slot *)0x0) {
        pSVar3 = pSVar9[2].next;
        uVar1 = *(uint *)((long)&pSVar9[1].next + 4);
        if (uVar1 == 0xffffffff) {
          iVar7 = ((int)lVar6 - (int)pSVar3) + (int)pSVar9[3].next;
          if (this->_bufferData[(long)pSVar3] == '\x04') {
            local_70 = (int *)(this->_bufferData + (long)pSVar3);
            *local_70 = iVar7;
            local_74 = iVar7;
            local_64 = iVar7;
            local_60 = local_70;
            local_54 = iVar7;
            local_50 = local_70;
          }
          else {
            if (this->_bufferData[(long)pSVar3] == '\x01') {
              local_8 = 0xffffff80;
              local_c = 0x7f;
              local_4 = iVar7;
              if (-0x81 < iVar7 && iVar7 < 0x80) {
                this->_bufferData[(long)pSVar3] = (uint8_t)iVar7;
                goto LAB_001eb748;
              }
            }
            local_304 = 0x2a;
          }
        }
        else {
          pCVar4 = (this->super_CodeEmitter)._code;
          in_stack_fffffffffffffc88 = &pCVar4->_relocations;
          if ((pCVar4->_relocations).super_ZoneVectorBase._length <= (ulong)uVar1) {
            DebugUtils::assertionFailed(in_stack_00000080,pos._4_4_,(char *)link);
          }
          lVar5 = *(long *)((long)(in_stack_fffffffffffffc88->super_ZoneVectorBase)._data +
                           (ulong)uVar1 * 8);
          *(long *)(lVar5 + 0x18) = lVar6 + *(long *)(lVar5 + 0x18);
          local_18 = in_stack_fffffffffffffc88;
        }
LAB_001eb748:
        pSVar3 = pSVar9->next;
        pCVar4 = (this->super_CodeEmitter)._code;
        pCVar4->_unresolvedLabelsCount = pCVar4->_unresolvedLabelsCount - 1;
        pCVar4 = (this->super_CodeEmitter)._code;
        local_e0 = &pCVar4->_baseHeap;
        local_f0 = 0x20;
        local_e8 = pSVar9;
        local_48 = local_e0;
        if (local_e0->_zone == (Zone *)0x0) {
          DebugUtils::assertionFailed(in_stack_00000080,pos._4_4_,(char *)link);
        }
        if (pSVar9 == (Slot *)0x0) {
          DebugUtils::assertionFailed(in_stack_00000080,pos._4_4_,(char *)link);
        }
        local_40 = local_f4;
        local_29 = 1;
        local_38 = 0x20;
        local_f0 = 0x20;
        pSVar9->next = (pCVar4->_baseHeap)._slots[0];
        (pCVar4->_baseHeap)._slots[0] = pSVar9;
      }
      local_d8 = this->_section;
      *(uint32_t *)(lVar8 + 0x18) = local_d8->_id;
      *(long *)(lVar8 + 0x20) = lVar6;
      *(undefined8 *)(lVar8 + 0x28) = 0;
      (this->super_CodeEmitter)._inlineComment = (char *)0x0;
      if (local_304 == 0) {
        local_1b8 = 0;
      }
      else {
        local_d0 = this;
        local_1b8 = CodeEmitter::setLastError
                              (in_stack_fffffffffffffc98,error,(char *)in_stack_fffffffffffffc88);
      }
    }
    else {
      local_1b8 = CodeEmitter::setLastError
                            (in_stack_fffffffffffffc98,error,(char *)in_stack_fffffffffffffc88);
    }
  }
  else {
    local_1b8 = (this->super_CodeEmitter)._lastError;
  }
  return local_1b8;
}

Assistant:

Error Assembler::bind(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  LabelEntry* le = _code->getLabelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return setLastError(DebugUtils::errored(kErrorLabelAlreadyBound));

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    StringBuilderTmp<256> sb;
    if (le->hasName())
      sb.setFormat("%s:", le->getName());
    else
      sb.setFormat("L%u:", Operand::unpackId(label.getId()));

    size_t binSize = 0;
    if (!_code->_logger->hasOption(Logger::kOptionBinaryForm))
      binSize = Globals::kInvalidIndex;

    Logging::formatLine(sb, nullptr, binSize, 0, 0, getInlineComment());
    _code->_logger->log(sb.getData(), sb.getLength());
  }
#endif // !ASMJIT_DISABLE_LOGGING

  Error err = kErrorOk;
  size_t pos = getOffset();

  LabelLink* link = le->_links;
  LabelLink* prev = nullptr;

  while (link) {
    intptr_t offset = link->offset;
    uint32_t relocId = link->relocId;

    if (relocId != RelocEntry::kInvalidId) {
      // Adjust relocation data.
      RelocEntry* re = _code->_relocations[relocId];
      re->_data += static_cast<uint64_t>(pos);
    }
    else {
      // Not using relocId, this means that we are overwriting a real
      // displacement in the CodeBuffer.
      int32_t patchedValue = static_cast<int32_t>(
        static_cast<intptr_t>(pos) - offset + link->rel);

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      uint32_t size = _bufferData[offset];
      if (size == 4)
        Utils::writeI32u(_bufferData + offset, static_cast<int32_t>(patchedValue));
      else if (size == 1 && Utils::isInt8(patchedValue))
        _bufferData[offset] = static_cast<uint8_t>(patchedValue & 0xFF);
      else
        err = DebugUtils::errored(kErrorInvalidDisplacement);
    }

    prev = link->prev;
    _code->_unresolvedLabelsCount--;
    _code->_baseHeap.release(link, sizeof(LabelLink));

    link = prev;
  }

  // Set as bound.
  le->_sectionId = _section->getId();
  le->_offset = pos;
  le->_links = nullptr;
  resetInlineComment();

  if (err != kErrorOk)
    return setLastError(err);

  return kErrorOk;
}